

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O1

_Bool cshutdn_destroy_oldest(cshutdn *cshutdn,Curl_easy *data,char *destination)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Curl_llist_node *n;
  void *pvVar4;
  Curl_llist_node *n_00;
  connectdata *conn;
  Curl_llist_node *n_01;
  bool bVar5;
  sigpipe_ignore pipe_st;
  sigpipe_ignore local_d0;
  
  n = Curl_llist_head(&cshutdn->list);
  bVar5 = n != (Curl_llist_node *)0x0;
  if (bVar5) {
    pvVar4 = Curl_node_elem(n);
    bVar1 = bVar5;
    n_00 = n;
    while ((n_01 = n, bVar2 = bVar5, destination != (char *)0x0 &&
           (iVar3 = strcmp(destination,*(char **)((long)pvVar4 + 0x58)), n_01 = n_00, bVar2 = bVar1,
           iVar3 != 0))) {
      n_00 = Curl_node_next(n_00);
      bVar1 = n_00 != (Curl_llist_node *)0x0;
      if (n_00 == (Curl_llist_node *)0x0) {
        return bVar1;
      }
      pvVar4 = Curl_node_elem(n_00);
    }
    bVar5 = bVar2;
    conn = (connectdata *)Curl_node_elem(n_01);
    Curl_node_remove(n_01);
    memset(&local_d0,0,0xa0);
    local_d0._152_1_ = local_d0._152_1_ | 1;
    sigpipe_apply(data,&local_d0);
    Curl_cshutdn_terminate(data,conn,false);
    if ((local_d0._152_1_ & 1) == 0) {
      sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
    }
  }
  return bVar5;
}

Assistant:

static bool cshutdn_destroy_oldest(struct cshutdn *cshutdn,
                                   struct Curl_easy *data,
                                   const char *destination)
{
  struct Curl_llist_node *e;
  struct connectdata *conn;

  e = Curl_llist_head(&cshutdn->list);
  while(e) {
    conn = Curl_node_elem(e);
    if(!destination || !strcmp(destination, conn->destination))
      break;
    e = Curl_node_next(e);
  }

  if(e) {
    SIGPIPE_VARIABLE(pipe_st);
    conn = Curl_node_elem(e);
    Curl_node_remove(e);
    sigpipe_init(&pipe_st);
    sigpipe_apply(data, &pipe_st);
    Curl_cshutdn_terminate(data, conn, FALSE);
    sigpipe_restore(&pipe_st);
    return TRUE;
  }
  return FALSE;
}